

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall embree::TokenStream::trySymbols(TokenStream *this,Token *token,ParseLocation *loc)

{
  pointer pbVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  string sStack_98;
  Token local_78;
  
  lVar5 = 0;
  uVar4 = 0;
  do {
    pbVar1 = (this->symbols).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->symbols).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (uVar3 <= uVar4) {
LAB_001b7118:
      return uVar4 < uVar3;
    }
    bVar2 = trySymbol(this,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&sStack_98,
                 (string *)
                 ((long)&(((this->symbols).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      Token::Token(&local_78,&sStack_98,TY_SYMBOL,loc);
      Token::operator=(token,&local_78);
      Token::~Token(&local_78);
      std::__cxx11::string::~string((string *)&sStack_98);
      goto LAB_001b7118;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x20;
  } while( true );
}

Assistant:

bool TokenStream::trySymbols(Token& token, const ParseLocation& loc)
  {
    for (size_t i=0; i<symbols.size(); i++) {
      if (!trySymbol(symbols[i])) continue;
      token = Token(symbols[i],Token::TY_SYMBOL,loc);
      return true;
    }
    return false;
  }